

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

HeapType __thiscall
wasm::TranslateToFuzzReader::getSubType(TranslateToFuzzReader *this,HeapType type)

{
  bool bVar1;
  BasicHeapType BVar2;
  FeatureOptions<wasm::HeapType> *pFVar3;
  pointer ppVar4;
  value_type *pvVar5;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *subTypes;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
  local_1f0;
  iterator iter;
  HeapType local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  HeapType local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  HeapType local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  HeapType local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  HeapType local_140;
  HeapType local_138;
  HeapType local_130;
  FeatureSet local_124;
  undefined8 local_120;
  FeatureSet local_114;
  undefined8 local_110;
  FeatureOptions<wasm::HeapType> local_108;
  undefined1 local_d0 [8];
  FeatureOptions<wasm::HeapType> options;
  HeapType local_90;
  undefined8 local_88;
  FeatureSet local_80 [4];
  undefined8 local_70;
  FeatureOptions<wasm::HeapType> local_68;
  HeapType local_30;
  Shareability local_24;
  TranslateToFuzzReader *pTStack_20;
  Shareability share;
  TranslateToFuzzReader *this_local;
  HeapType type_local;
  
  pTStack_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = oneIn(this,3);
  if (bVar1) {
    return (HeapType)(HeapType)this_local;
  }
  bVar1 = HeapType::isBasic((HeapType *)&this_local);
  if ((bVar1) && (bVar1 = oneIn(this,2), bVar1)) {
    local_24 = wasm::HeapType::getShared();
    BVar2 = HeapType::getBasic((HeapType *)&this_local,Unshared);
    switch(BVar2) {
    case ext:
      bVar1 = FeatureSet::hasReferenceTypes(&this->wasm->features);
      if (!bVar1) {
        __assert_fail("wasm.features.hasReferenceTypes()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0x1557,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
      }
      local_108.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      local_108.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_108.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_108.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      local_108.options._M_t._M_impl._0_8_ = 0;
      local_108.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_108.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      Random::FeatureOptions<wasm::HeapType>::FeatureOptions(&local_108);
      local_110 = 8;
      pFVar3 = Random::FeatureOptions<wasm::HeapType>::add(&local_108,(HeapType)0x8);
      FeatureSet::FeatureSet(&local_114,0x400);
      local_120 = 0x60;
      pFVar3 = Random::FeatureOptions<wasm::HeapType>::add<>(pFVar3,local_114,(HeapType)0x60);
      Random::FeatureOptions<wasm::HeapType>::FeatureOptions
                ((FeatureOptions<wasm::HeapType> *)local_d0,pFVar3);
      Random::FeatureOptions<wasm::HeapType>::~FeatureOptions(&local_108);
      if (local_24 == Unshared) {
        FeatureSet::FeatureSet(&local_124,0x4000);
        HeapType::HeapType(&local_130,string);
        Random::FeatureOptions<wasm::HeapType>::add<>
                  ((FeatureOptions<wasm::HeapType> *)local_d0,local_124,local_130);
      }
      local_138 = pick<wasm::HeapType>(this,(FeatureOptions<wasm::HeapType> *)local_d0);
      BVar2 = HeapType::getBasic(&local_138,local_24);
      HeapType::HeapType(&type_local,BVar2);
      Random::FeatureOptions<wasm::HeapType>::~FeatureOptions
                ((FeatureOptions<wasm::HeapType> *)local_d0);
      break;
    case func:
      bVar1 = FeatureSet::hasReferenceTypes(&this->wasm->features);
      if (!bVar1) {
        __assert_fail("wasm.features.hasReferenceTypes()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0x154f,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
      }
      local_68.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      local_68.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_68.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_68.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      local_68.options._M_t._M_impl._0_8_ = 0;
      local_68.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_68.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      Random::FeatureOptions<wasm::HeapType>::FeatureOptions(&local_68);
      local_70 = 0x10;
      pFVar3 = Random::FeatureOptions<wasm::HeapType>::add(&local_68,(HeapType)0x10);
      FeatureSet::FeatureSet(local_80,0x400);
      local_88 = 0x68;
      pFVar3 = Random::FeatureOptions<wasm::HeapType>::add<>(pFVar3,local_80[0],(HeapType)0x68);
      local_30 = pick<wasm::HeapType>(this,pFVar3);
      BVar2 = HeapType::getBasic(&local_30,local_24);
      HeapType::HeapType(&type_local,BVar2);
      Random::FeatureOptions<wasm::HeapType>::~FeatureOptions(&local_68);
      break;
    case cont:
      options.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0x70;
      local_90 = pick<wasm::HeapType,wasm::HeapType>(this,(HeapType)0x18,(HeapType)0x70);
      BVar2 = HeapType::getBasic(&local_90,local_24);
      HeapType::HeapType(&type_local,BVar2);
      break;
    case any:
      bVar1 = FeatureSet::hasReferenceTypes(&this->wasm->features);
      if (!bVar1) {
        __assert_fail("wasm.features.hasReferenceTypes()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0x1562,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
      }
      bVar1 = FeatureSet::hasGC(&this->wasm->features);
      if (!bVar1) {
        __assert_fail("wasm.features.hasGC()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0x1563,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
      }
      local_148 = 0x20;
      local_150 = 0x28;
      local_158 = 0x30;
      local_160 = 0x38;
      local_168 = 0x40;
      local_170 = 0x58;
      local_140 = pick<wasm::HeapType,wasm::HeapType,wasm::HeapType,wasm::HeapType,wasm::HeapType,wasm::HeapType>
                            (this,(HeapType)0x20,(HeapType)0x28,(HeapType)0x30,(HeapType)0x38,
                             (HeapType)0x40,(HeapType)0x58);
      BVar2 = HeapType::getBasic(&local_140,local_24);
      HeapType::HeapType(&type_local,BVar2);
      break;
    case eq:
      bVar1 = FeatureSet::hasReferenceTypes(&this->wasm->features);
      if (!bVar1) {
        __assert_fail("wasm.features.hasReferenceTypes()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0x156d,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
      }
      bVar1 = FeatureSet::hasGC(&this->wasm->features);
      if (!bVar1) {
        __assert_fail("wasm.features.hasGC()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0x156e,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
      }
      local_180 = 0x28;
      local_188 = 0x30;
      local_190 = 0x38;
      local_198 = 0x40;
      local_1a0 = 0x58;
      local_178 = pick<wasm::HeapType,wasm::HeapType,wasm::HeapType,wasm::HeapType,wasm::HeapType>
                            (this,(HeapType)0x28,(HeapType)0x30,(HeapType)0x38,(HeapType)0x40,
                             (HeapType)0x58);
      BVar2 = HeapType::getBasic(&local_178,local_24);
      HeapType::HeapType(&type_local,BVar2);
      break;
    case i31:
      local_1b0 = 0x30;
      local_1b8 = 0x58;
      local_1a8 = pick<wasm::HeapType,wasm::HeapType>(this,(HeapType)0x30,(HeapType)0x58);
      BVar2 = HeapType::getBasic(&local_1a8,local_24);
      HeapType::HeapType(&type_local,BVar2);
      break;
    case struct_:
      local_1c8 = 0x38;
      local_1d0 = 0x58;
      local_1c0 = pick<wasm::HeapType,wasm::HeapType>(this,(HeapType)0x38,(HeapType)0x58);
      BVar2 = HeapType::getBasic(&local_1c0,local_24);
      HeapType::HeapType(&type_local,BVar2);
      break;
    case array:
      iter.
      super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
                 )(__node_type *)0x58;
      local_1d8 = pick<wasm::HeapType,wasm::HeapType>(this,(HeapType)0x40,(HeapType)0x58);
      BVar2 = HeapType::getBasic(&local_1d8,local_24);
      HeapType::HeapType(&type_local,BVar2);
      break;
    case exn:
      if (local_24 != Unshared) {
        __assert_fail("share == Unshared",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0x157c,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
      }
      BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::exn,Unshared);
      HeapType::HeapType(&type_local,BVar2);
      break;
    case string:
      if (local_24 != Unshared) {
        __assert_fail("share == Unshared",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0x157f,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
      }
      HeapType::HeapType(&type_local,string);
      break;
    case none:
    case noext:
    case nofunc:
    case nocont:
    case noexn:
    default:
      goto LAB_001f5649;
    }
  }
  else {
LAB_001f5649:
    local_1f0._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
         ::find(&this->interestingHeapSubTypes,(key_type *)&this_local);
    subTypes = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               std::
               unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
               ::end(&this->interestingHeapSubTypes);
    bVar1 = std::__detail::operator!=
                      (&local_1f0,
                       (_Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
                        *)&subTypes);
    if (bVar1) {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_false,_true>
                             *)&local_1f0);
      bVar1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::empty(&ppVar4->second);
      if (!bVar1) {
        pvVar5 = pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                           (this,&ppVar4->second);
        return (HeapType)pvVar5->id;
      }
    }
    type_local.id = (uintptr_t)this_local;
  }
  return (HeapType)type_local.id;
}

Assistant:

HeapType TranslateToFuzzReader::getSubType(HeapType type) {
  if (oneIn(3)) {
    return type;
  }
  if (type.isBasic() && oneIn(2)) {
    auto share = type.getShared();
    switch (type.getBasic(Unshared)) {
      case HeapType::func:
        // TODO: Typed function references.
        assert(wasm.features.hasReferenceTypes());
        return pick(FeatureOptions<HeapType>()
                      .add(HeapTypes::func)
                      .add(FeatureSet::GC, HeapTypes::nofunc))
          .getBasic(share);
      case HeapType::cont:
        return pick(HeapTypes::cont, HeapTypes::nocont).getBasic(share);
      case HeapType::ext: {
        assert(wasm.features.hasReferenceTypes());
        auto options = FeatureOptions<HeapType>()
                         .add(HeapTypes::ext)
                         .add(FeatureSet::GC, HeapTypes::noext);
        if (share == Unshared) {
          // Shared strings not yet supported.
          options.add(FeatureSet::Strings, HeapType::string);
        }
        return pick(options).getBasic(share);
      }
      case HeapType::any: {
        assert(wasm.features.hasReferenceTypes());
        assert(wasm.features.hasGC());
        return pick(HeapTypes::any,
                    HeapTypes::eq,
                    HeapTypes::i31,
                    HeapTypes::struct_,
                    HeapTypes::array,
                    HeapTypes::none)
          .getBasic(share);
      }
      case HeapType::eq:
        assert(wasm.features.hasReferenceTypes());
        assert(wasm.features.hasGC());
        return pick(HeapTypes::eq,
                    HeapTypes::i31,
                    HeapTypes::struct_,
                    HeapTypes::array,
                    HeapTypes::none)
          .getBasic(share);
      case HeapType::i31:
        return pick(HeapTypes::i31, HeapTypes::none).getBasic(share);
      case HeapType::struct_:
        return pick(HeapTypes::struct_, HeapTypes::none).getBasic(share);
      case HeapType::array:
        return pick(HeapTypes::array, HeapTypes::none).getBasic(share);
      case HeapType::exn:
        assert(share == Unshared);
        return HeapTypes::exn.getBasic(share);
      case HeapType::string:
        assert(share == Unshared);
        return HeapType::string;
      case HeapType::none:
      case HeapType::noext:
      case HeapType::nofunc:
      case HeapType::nocont:
      case HeapType::noexn:
        break;
    }
  }
  // Look for an interesting subtype.
  auto iter = interestingHeapSubTypes.find(type);
  if (iter != interestingHeapSubTypes.end()) {
    auto& subTypes = iter->second;
    if (!subTypes.empty()) {
      return pick(subTypes);
    }
  }
  // Failure to do anything interesting, return the type.
  return type;
}